

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::restructureIf(wasm::Block__
          (void *this,Block *curr)

{
  Id IVar1;
  char *pcVar2;
  Expression **ppEVar3;
  Expression *pEVar4;
  ulong uVar5;
  Expression *pEVar6;
  bool bVar7;
  bool bVar8;
  Index IVar9;
  Nop *output;
  Unary *condition;
  If *expression;
  Select *expression_00;
  Expression *pEVar10;
  Id IVar11;
  ulong in_R8;
  Nop *ret;
  optional<wasm::Type> type_;
  Name target;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  EffectAnalyzer local_1b0;
  undefined1 local_50 [8];
  Nop nop;
  Builder local_38;
  Builder builder;
  
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements < 2) {
    __assert_fail("list.size() >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                  ,0x523,
                  "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::restructureIf(Block *)"
                 );
  }
  pcVar2 = (curr->name).super_IString.str._M_str;
  if (pcVar2 == (char *)0x0) {
    return;
  }
  pEVar10 = *(curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
             .data;
  IVar1 = pEVar10->_id;
  IVar11 = IVar1;
  if (IVar1 == DropId) {
    pEVar10 = *(Expression **)(pEVar10 + 1);
    IVar11 = pEVar10->_id;
  }
  local_38.wasm = *(Module **)((long)this + 0xd0);
  if (IVar11 != BreakId) {
    return;
  }
  if (pEVar10[2].type.id == 0) {
    return;
  }
  if ((char *)pEVar10[1].type.id != pcVar2) {
    return;
  }
  if ((pEVar10->type).id == 1) {
    return;
  }
  target.super_IString.str._M_str = (char *)pEVar10;
  target.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
  IVar9 = BranchUtils::BranchSeeker::count
                    ((BranchSeeker *)curr,(Expression *)(curr->name).super_IString.str._M_len,target
                    );
  if (IVar9 != 1) {
    return;
  }
  if (IVar1 != DropId) {
    if (*(long *)(pEVar10 + 2) == 0) {
      condition = Builder::makeUnary(&local_38,EqZInt32,(Expression *)pEVar10[2].type.id);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
      expression = Builder::makeIf(&local_38,(Expression *)condition,(Expression *)curr,
                                   (Expression *)0x0,type);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                 (Expression *)expression);
      pEVar10->_id = NopId;
      (pEVar10->type).id = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
      Block::finalize(curr,type_,Unknown);
      return;
    }
    __assert_fail("!br->value",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                  ,0x536,
                  "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::restructureIf(Block *)"
                 );
  }
  EffectAnalyzer::EffectAnalyzer
            (&local_1b0,*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),
             *(Expression **)(pEVar10 + 2));
  if (local_1b0.trap == false) {
    bVar7 = EffectAnalyzer::hasNonTrapSideEffects(&local_1b0);
    EffectAnalyzer::~EffectAnalyzer(&local_1b0);
    if (!bVar7) {
      bVar7 = EffectAnalyzer::canReorder
                        (*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),
                         (Expression *)pEVar10[2].type.id,*(Expression **)(pEVar10 + 2));
      if (!bVar7) {
        return;
      }
      if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements == 0) goto LAB_00aa4090;
      pEVar4 = *(curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      pEVar4->_id = NopId;
      (pEVar4->type).id = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
      expression_00 =
           (Select *)
           Builder::makeIf(&local_38,(Expression *)pEVar10[2].type.id,*(Expression **)(pEVar10 + 2),
                           (Expression *)curr,type_00);
      goto LAB_00aa4054;
    }
  }
  else {
    EffectAnalyzer::~EffectAnalyzer(&local_1b0);
  }
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    ppEVar3 = (curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type.id =
         (uintptr_t)*ppEVar3;
    local_50[0] = NopId;
    nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression._id = InvalidId;
    nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression._1_7_ = 0;
    *ppEVar3 = (Expression *)local_50;
    bVar7 = EffectAnalyzer::canReorder
                      (*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),
                       (Expression *)pEVar10[2].type.id,(Expression *)curr);
    EffectAnalyzer::EffectAnalyzer
              (&local_1b0,*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),
               (Expression *)curr);
    bVar8 = true;
    if (local_1b0.trap == false) {
      bVar8 = EffectAnalyzer::hasNonTrapSideEffects(&local_1b0);
    }
    EffectAnalyzer::~EffectAnalyzer(&local_1b0);
    if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements != 0) {
      *(curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
           = (Expression *)
             nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type.id;
      if (bVar8 != false || !bVar7) {
        return;
      }
      pEVar4 = *(Expression **)(pEVar10 + 2);
      uVar5 = (pEVar4->type).id;
      if (uVar5 < 2) {
        return;
      }
      if ((6 < uVar5 & (byte)uVar5) != 0) {
        return;
      }
      uVar5 = (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
      if (uVar5 < 2) {
        return;
      }
      if ((6 < uVar5 & (byte)uVar5) != 0) {
        return;
      }
      pEVar6 = *(curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      pEVar6->_id = NopId;
      (pEVar6->type).id = 0;
      expression_00 =
           Builder::makeSelect(&local_38,(Expression *)pEVar10[2].type.id,pEVar4,(Expression *)curr)
      ;
LAB_00aa4054:
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                 (Expression *)expression_00);
      return;
    }
  }
LAB_00aa4090:
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

void restructureIf(Block* curr) {
        auto& list = curr->list;
        // We should be called only on potentially-interesting lists.
        assert(list.size() >= 2);
        if (curr->name.is()) {
          Break* br = nullptr;
          Drop* drop = list[0]->dynCast<Drop>();
          if (drop) {
            br = drop->value->dynCast<Break>();
          } else {
            br = list[0]->dynCast<Break>();
          }
          // Check if the br is conditional and goes to the block. It may or may
          // not have a value, depending on if it was dropped or not. If the
          // type is unreachable that means it is not actually reached, which we
          // can ignore.
          Builder builder(*getModule());
          if (br && br->condition && br->name == curr->name &&
              br->type != Type::unreachable) {
            if (BranchUtils::BranchSeeker::count(curr, curr->name) == 1) {
              // no other breaks to that name, so we can do this
              if (!drop) {
                assert(!br->value);
                replaceCurrent(builder.makeIf(
                  builder.makeUnary(EqZInt32, br->condition), curr));
                ExpressionManipulator::nop(br);
                curr->finalize(curr->type);
              } else {
                // To use an if, the value must have no side effects, as in the
                // if it may not execute.
                if (!EffectAnalyzer(passOptions, *getModule(), br->value)
                       .hasSideEffects()) {
                  // We also need to reorder the condition and the value.
                  if (EffectAnalyzer::canReorder(
                        passOptions, *getModule(), br->condition, br->value)) {
                    ExpressionManipulator::nop(list[0]);
                    replaceCurrent(
                      builder.makeIf(br->condition, br->value, curr));
                  }
                } else {
                  // The value has side effects, so it must always execute. We
                  // may still be able to optimize this, however, by using a
                  // select:
                  //   (block $x
                  //     (drop (br_if $x (value) (cond)))
                  //     ..., no other references to $x
                  //     ..final element..
                  //   )
                  // =>
                  //   (select
                  //     (value)
                  //     (block $x
                  //       ..., no other references to $x
                  //       ..final element..
                  //     )
                  //     (cond)
                  //   )
                  // To do this we must be able to reorder the condition with
                  // the rest of the block (but not the value), and we must be
                  // able to make the rest of the block always execute, so it
                  // must not have side effects.
                  // TODO: we can do this when there *are* other refs to $x,
                  //       with a larger refactoring here.

                  // Test for the conditions with a temporary nop instead of the
                  // br_if.
                  Expression* old = list[0];
                  Nop nop;
                  // After this assignment, curr is what is left in the block
                  // after ignoring the br_if.
                  list[0] = &nop;
                  auto canReorder = EffectAnalyzer::canReorder(
                    passOptions, *getModule(), br->condition, curr);
                  auto hasSideEffects =
                    EffectAnalyzer(passOptions, *getModule(), curr)
                      .hasSideEffects();
                  list[0] = old;
                  if (canReorder && !hasSideEffects &&
                      Properties::canEmitSelectWithArms(br->value, curr)) {
                    ExpressionManipulator::nop(list[0]);
                    replaceCurrent(
                      builder.makeSelect(br->condition, br->value, curr));
                  }
                }
              }
            }
          }
        }
      }